

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cc
# Opt level: O3

string * __thiscall
muduo::CurrentThread::stackTrace_abi_cxx11_
          (string *__return_storage_ptr__,CurrentThread *this,bool demangle)

{
  char cVar1;
  uint uVar2;
  void *__ptr;
  char *pcVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int status;
  size_t len;
  void *frame [200];
  int local_69c;
  void *local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_690;
  ulong local_688;
  undefined8 local_680;
  undefined1 local_678 [1608];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = backtrace(local_678,200,CONCAT71(in_register_00000011,demangle));
  __ptr = (void *)backtrace_symbols(local_678,uVar2);
  if (__ptr != (void *)0x0) {
    local_680 = 0x100;
    if ((char)this == '\0') {
      local_698 = (void *)0x0;
    }
    else {
      local_698 = malloc(0x100);
    }
    if (1 < (int)uVar2) {
      local_688 = (ulong)uVar2;
      uVar5 = 1;
      local_690 = &__return_storage_ptr__->field_2;
      do {
        if ((char)this == '\0') {
LAB_00118436:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else {
          pcVar6 = (char *)0x0;
          pcVar8 = (char *)0x0;
          for (pcVar3 = *(char **)((long)__ptr + uVar5 * 8);
              ((cVar1 = *pcVar3, pcVar7 = pcVar3, pcVar9 = pcVar8, cVar1 == '(' ||
               (pcVar7 = pcVar6, pcVar9 = pcVar3, cVar1 == '+')) || (pcVar9 = pcVar8, cVar1 != '\0')
              ); pcVar3 = pcVar3 + 1) {
            pcVar6 = pcVar7;
            pcVar8 = pcVar9;
          }
          if (pcVar6 == (char *)0x0 || pcVar8 == (char *)0x0) goto LAB_00118436;
          *pcVar8 = '\0';
          local_69c = 0;
          pvVar4 = (void *)__cxa_demangle(pcVar6 + 1,local_698,&local_680,&local_69c);
          *pcVar8 = '+';
          if (local_69c != 0) goto LAB_00118436;
          std::__cxx11::string::replace
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                     (char *)0x0,*(ulong *)((long)__ptr + uVar5 * 8));
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          local_698 = pvVar4;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_688);
    }
    free(local_698);
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

string stackTrace(bool demangle)
{
  string stack;
  const int max_frames = 200;
  void* frame[max_frames];
  int nptrs = ::backtrace(frame, max_frames);
  char** strings = ::backtrace_symbols(frame, nptrs);
  if (strings)
  {
    size_t len = 256;
    char* demangled = demangle ? static_cast<char*>(::malloc(len)) : nullptr;
    for (int i = 1; i < nptrs; ++i)  // skipping the 0-th, which is this function
    {
      if (demangle)
      {
        // https://panthema.net/2008/0901-stacktrace-demangled/
        // bin/exception_test(_ZN3Bar4testEv+0x79) [0x401909]
        char* left_par = nullptr;
        char* plus = nullptr;
        for (char* p = strings[i]; *p; ++p)
        {
          if (*p == '(')
            left_par = p;
          else if (*p == '+')
            plus = p;
        }

        if (left_par && plus)
        {
          *plus = '\0';
          int status = 0;
          char* ret = abi::__cxa_demangle(left_par+1, demangled, &len, &status);
          *plus = '+';
          if (status == 0)
          {
            demangled = ret;  // ret could be realloc()
            stack.append(strings[i], left_par+1);
            stack.append(demangled);
            stack.append(plus);
            stack.push_back('\n');
            continue;
          }
        }
      }
      // Fallback to mangled names
      stack.append(strings[i]);
      stack.push_back('\n');
    }
    free(demangled);
    free(strings);
  }
  return stack;
}